

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O1

void __thiscall
google::protobuf::io::CopyingOutputStreamAdaptor::~CopyingOutputStreamAdaptor
          (CopyingOutputStreamAdaptor *this)

{
  uchar *puVar1;
  
  (this->super_ZeroCopyOutputStream)._vptr_ZeroCopyOutputStream =
       (_func_int **)&PTR__CopyingOutputStreamAdaptor_00212350;
  WriteBuffer(this);
  if ((this->owns_copying_stream_ == true) && (this->copying_stream_ != (CopyingOutputStream *)0x0))
  {
    (*this->copying_stream_->_vptr_CopyingOutputStream[1])();
  }
  puVar1 = (this->buffer_)._M_t.
           super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
           super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  if (puVar1 != (uchar *)0x0) {
    operator_delete__(puVar1);
  }
  (this->buffer_)._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
  _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = (uchar *)0x0;
  return;
}

Assistant:

CopyingOutputStreamAdaptor::~CopyingOutputStreamAdaptor() {
  WriteBuffer();
  if (owns_copying_stream_) {
    delete copying_stream_;
  }
}